

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

void __thiscall acto::core::msg_wrap_t<A::MR>::~msg_wrap_t(msg_wrap_t<A::MR> *this)

{
  ~msg_wrap_t(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

constexpr msg_wrap_t(T&& d) noexcept(
    std::is_nothrow_constructible_v<message_container_t<T>, T&&>)
    : msg_t(typeid(T))
    , message_container_t<T>(std::move(d)) {
  }